

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void load_pixel_w8(uint8_t *above,uint8_t *left,int height,__m128i *pixels)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  longlong lVar9;
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  ushort uVar16;
  undefined1 uVar20;
  undefined1 auVar17 [16];
  __m128i alVar18;
  __m128i alVar19;
  __m128i alVar21;
  undefined4 uVar24;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar17 = pshuflw(ZEXT116(left[(long)height + -1]),ZEXT116(left[(long)height + -1]),0);
  uVar1 = *(ulong *)above;
  uVar20 = (undefined1)(uVar1 >> 0x38);
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = uVar20;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar7._8_7_;
  Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var11;
  auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar12[0] = (char)(uVar1 >> 0x10);
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar12;
  auVar13._1_12_ = SUB1512(auVar15 << 0x20,3);
  auVar13[0] = (char)(uVar1 >> 8);
  uVar16 = CONCAT11(0,(byte)uVar1);
  auVar8._2_13_ = auVar13;
  auVar8._0_2_ = uVar16;
  uVar26 = auVar17._2_2_;
  auVar23._0_12_ = auVar8._0_12_;
  auVar23._12_2_ = (short)Var11;
  auVar23._14_2_ = uVar26;
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = auVar8._0_10_;
  uVar25 = auVar17._0_2_;
  auVar22._10_2_ = uVar25;
  alVar21[1]._2_6_ = auVar22._10_6_;
  alVar21[1]._0_2_ = auVar12._0_2_;
  alVar21[0]._6_2_ = uVar26;
  alVar21[0]._4_2_ = auVar13._0_2_;
  alVar21[0]._2_2_ = uVar25;
  alVar21[0]._0_2_ = uVar16;
  *pixels = alVar21;
  alVar18[0]._2_2_ = uVar25;
  alVar18[0]._0_2_ = auVar7._8_2_;
  alVar18[0]._4_2_ = auVar5._10_2_;
  alVar18[0]._6_2_ = uVar26;
  alVar18[1]._0_2_ = auVar3._12_2_;
  alVar18[1]._2_2_ = uVar25;
  alVar18[1]._4_1_ = uVar20;
  alVar18[1]._5_1_ = 0;
  alVar18[1]._6_2_ = uVar26;
  pixels[1] = alVar18;
  auVar17 = pshuflw(ZEXT116(above[7]),ZEXT116(above[7]),0);
  uVar24 = auVar17._0_4_;
  *(undefined4 *)pixels[3] = uVar24;
  *(undefined4 *)((long)pixels[3] + 4) = uVar24;
  *(undefined4 *)(pixels[3] + 1) = uVar24;
  *(undefined4 *)((long)pixels[3] + 0xc) = uVar24;
  if (height == 0x10) {
    alVar19 = *(__m128i *)left;
  }
  else if (height == 8) {
    alVar19[1] = 0;
    alVar19[0] = *(ulong *)left;
  }
  else {
    if (height != 4) {
      lVar9 = *(longlong *)(left + 8);
      pixels[2][0] = *(longlong *)left;
      pixels[2][1] = lVar9;
      pixels[4] = alVar21;
      pixels[5] = alVar18;
      lVar9 = *(longlong *)(left + 0x18);
      pixels[6][0] = *(longlong *)(left + 0x10);
      pixels[6][1] = lVar9;
      *(undefined4 *)pixels[7] = uVar24;
      *(undefined4 *)((long)pixels[7] + 4) = uVar24;
      *(undefined4 *)(pixels[7] + 1) = uVar24;
      *(undefined4 *)((long)pixels[7] + 0xc) = uVar24;
      return;
    }
    alVar19 = (__m128i)ZEXT416(*(uint *)left);
  }
  pixels[2] = alVar19;
  return;
}

Assistant:

static inline void load_pixel_w8(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  __m128i d = _mm_loadl_epi64((const __m128i *)above);
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
  pixels[1] = _mm_unpackhi_epi16(d, bp);

  pixels[3] = _mm_set1_epi16((int16_t)above[7]);

  if (height == 4) {
    pixels[2] = _mm_cvtsi32_si128(((const int *)left)[0]);
  } else if (height == 8) {
    pixels[2] = _mm_loadl_epi64((const __m128i *)left);
  } else if (height == 16) {
    pixels[2] = _mm_load_si128((const __m128i *)left);
  } else {
    pixels[2] = _mm_load_si128((const __m128i *)left);
    pixels[4] = pixels[0];
    pixels[5] = pixels[1];
    pixels[6] = _mm_load_si128((const __m128i *)(left + 16));
    pixels[7] = pixels[3];
  }
}